

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack2_32(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  
  auVar6 = vpbroadcastd_avx512f(ZEXT416(*in));
  auVar2 = vpmovsxbd_avx2(ZEXT816(0x100e0c0a08060402));
  auVar7 = vpmovsxbd_avx512f(_DAT_00194250);
  auVar1 = vpmovsxbd_avx(ZEXT416(0x18161412));
  auVar8 = vpmovsxbd_avx512f(_DAT_00194260);
  auVar13._8_8_ = 0x1c0000001a;
  auVar13._0_8_ = 0x1c0000001a;
  auVar9 = vpmovsxbd_avx512f(_DAT_00194230);
  auVar10 = vpbroadcastd_avx512f(ZEXT416(3));
  auVar11 = vpmovsxbd_avx512f(_DAT_001a0370);
  auVar5 = vpsrlvd_avx2(auVar6._0_32_,auVar2);
  auVar3 = vpsrlvd_avx2(auVar6._0_16_,auVar1);
  auVar4 = vpsrlvd_avx2(auVar6._0_16_,auVar13);
  auVar12 = vpermt2d_avx512f(ZEXT3264(auVar5),auVar7,auVar6);
  auVar12 = vpermt2d_avx512f(auVar12,auVar8,ZEXT1664(auVar3));
  auVar12 = vpermt2d_avx512f(auVar12,auVar9,ZEXT1664(auVar4));
  auVar12 = vpandd_avx512f(auVar12,auVar10);
  auVar6 = vpsrlvd_avx512f(auVar6,auVar11);
  auVar6._0_60_ = auVar12._0_60_;
  auVar12 = vpbroadcastd_avx512f(ZEXT416(in[1]));
  auVar6 = vmovdqu64_avx512f(auVar6);
  *(undefined1 (*) [64])out = auVar6;
  auVar2 = vpsrlvd_avx2(auVar12._0_32_,auVar2);
  auVar1 = vpsrlvd_avx2(auVar12._0_16_,auVar1);
  auVar3 = vpsrlvd_avx2(auVar12._0_16_,auVar13);
  auVar6 = vpermt2d_avx512f(ZEXT3264(auVar2),auVar7,auVar12);
  auVar6 = vpermt2d_avx512f(auVar6,auVar8,ZEXT1664(auVar1));
  auVar6 = vpermt2d_avx512f(auVar6,auVar9,ZEXT1664(auVar3));
  auVar6 = vpandd_avx512f(auVar6,auVar10);
  auVar7 = vpsrlvd_avx512f(auVar12,auVar11);
  auVar7._0_60_ = auVar6._0_60_;
  auVar6 = vmovdqu64_avx512f(auVar7);
  *(undefined1 (*) [64])(out + 0x10) = auVar6;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack2_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 2);
  out++;
  *out = ((*in) >> 2) % (1U << 2);
  out++;
  *out = ((*in) >> 4) % (1U << 2);
  out++;
  *out = ((*in) >> 6) % (1U << 2);
  out++;
  *out = ((*in) >> 8) % (1U << 2);
  out++;
  *out = ((*in) >> 10) % (1U << 2);
  out++;
  *out = ((*in) >> 12) % (1U << 2);
  out++;
  *out = ((*in) >> 14) % (1U << 2);
  out++;
  *out = ((*in) >> 16) % (1U << 2);
  out++;
  *out = ((*in) >> 18) % (1U << 2);
  out++;
  *out = ((*in) >> 20) % (1U << 2);
  out++;
  *out = ((*in) >> 22) % (1U << 2);
  out++;
  *out = ((*in) >> 24) % (1U << 2);
  out++;
  *out = ((*in) >> 26) % (1U << 2);
  out++;
  *out = ((*in) >> 28) % (1U << 2);
  out++;
  *out = ((*in) >> 30);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 2);
  out++;
  *out = ((*in) >> 2) % (1U << 2);
  out++;
  *out = ((*in) >> 4) % (1U << 2);
  out++;
  *out = ((*in) >> 6) % (1U << 2);
  out++;
  *out = ((*in) >> 8) % (1U << 2);
  out++;
  *out = ((*in) >> 10) % (1U << 2);
  out++;
  *out = ((*in) >> 12) % (1U << 2);
  out++;
  *out = ((*in) >> 14) % (1U << 2);
  out++;
  *out = ((*in) >> 16) % (1U << 2);
  out++;
  *out = ((*in) >> 18) % (1U << 2);
  out++;
  *out = ((*in) >> 20) % (1U << 2);
  out++;
  *out = ((*in) >> 22) % (1U << 2);
  out++;
  *out = ((*in) >> 24) % (1U << 2);
  out++;
  *out = ((*in) >> 26) % (1U << 2);
  out++;
  *out = ((*in) >> 28) % (1U << 2);
  out++;
  *out = ((*in) >> 30);
  ++in;
  out++;

  return in;
}